

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

Command * __thiscall
cmState::GetDependencyProviderCommand(Command *__return_storage_ptr__,cmState *this,Method method)

{
  __normal_iterator<const_cmDependencyProvider::Method_*,_std::vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>_>
  _Var1;
  undefined1 local_14 [4];
  
  if (((this->DependencyProvider).super__Optional_base<cmDependencyProvider,_false,_false>.
       _M_payload.super__Optional_payload<cmDependencyProvider,_true,_false,_false>.
       super__Optional_payload_base<cmDependencyProvider>._M_engaged == true) &&
     (_Var1 = std::
              __find_if<__gnu_cxx::__normal_iterator<cmDependencyProvider::Method_const*,std::vector<cmDependencyProvider::Method,std::allocator<cmDependencyProvider::Method>>>,__gnu_cxx::__ops::_Iter_equals_val<cmDependencyProvider::Method_const>>
                        (*(undefined8 *)
                          &(this->DependencyProvider).
                           super__Optional_base<cmDependencyProvider,_false,_false>._M_payload.
                           super__Optional_payload<cmDependencyProvider,_true,_false,_false>.
                           super__Optional_payload_base<cmDependencyProvider>._M_payload._M_value.
                           Methods.
                           super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                         ,*(pointer *)
                           ((long)&(this->DependencyProvider).
                                   super__Optional_base<cmDependencyProvider,_false,_false>.
                                   _M_payload.
                                   super__Optional_payload<cmDependencyProvider,_true,_false,_false>
                                   .super__Optional_payload_base<cmDependencyProvider>._M_payload.
                                   _M_value.Methods + 8),local_14),
     _Var1._M_current !=
     *(pointer *)
      ((long)&(this->DependencyProvider).super__Optional_base<cmDependencyProvider,_false,_false>.
              _M_payload.super__Optional_payload<cmDependencyProvider,_true,_false,_false>.
              super__Optional_payload_base<cmDependencyProvider>._M_payload._M_value.Methods + 8)))
  {
    GetCommand(__return_storage_ptr__,this,(string *)&this->DependencyProvider);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

cmState::Command cmState::GetDependencyProviderCommand(
  cmDependencyProvider::Method method) const
{
  return (this->DependencyProvider &&
          this->DependencyProvider->SupportsMethod(method))
    ? this->GetCommand(this->DependencyProvider->GetCommand())
    : Command{};
}